

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O2

Polynomial<double> __thiscall gmath::d<double>(gmath *this,Polynomial<double> *p)

{
  double *extraout_RDX;
  double *pdVar1;
  double *extraout_RDX_00;
  int i_00;
  int i;
  long lVar2;
  Polynomial<double> PVar3;
  
  Polynomial<double>::Polynomial((Polynomial<double> *)this);
  i_00 = 0;
  pdVar1 = extraout_RDX;
  for (lVar2 = 1; lVar2 < p->used; lVar2 = lVar2 + 1) {
    Polynomial<double>::set((Polynomial<double> *)this,i_00,(double)(int)lVar2 * p->c[lVar2]);
    i_00 = i_00 + 1;
    pdVar1 = extraout_RDX_00;
  }
  PVar3.c = pdVar1;
  PVar3._0_8_ = this;
  return PVar3;
}

Assistant:

inline Polynomial<T> d(const Polynomial<T> &p)
{
  Polynomial<T> ret;

  for (int i=1; i<=p.getDegree(); i++)
  {
    ret.set(i-1, i*p[i]);
  }

  return ret;
}